

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O1

void __thiscall QUrlQuery::removeAllQueryItems(QUrlQuery *this,QString *key)

{
  uint uVar1;
  QUrlQueryPrivate *pQVar2;
  pair<QString,_QString> *ppVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  qsizetype qVar7;
  iterator aend;
  iterator iVar8;
  pair<QString,_QString> *ppVar9;
  pair<QString,_QString> *ppVar10;
  type __p;
  type ppVar11;
  pair<QString,_QString> *ppVar12;
  const_iterator abegin;
  qsizetype qVar13;
  long lVar14;
  Map *this_00;
  char16_t *pcVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  QStringView in;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView rhs_05;
  QStringView rhs_06;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QStringView lhs_03;
  QStringView lhs_04;
  QStringView lhs_05;
  QStringView lhs_06;
  QArrayData *local_68;
  undefined1 local_58 [16];
  long local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr == (QUrlQueryPrivate *)0x0) goto LAB_002697fe;
  QSharedDataPointer<QUrlQueryPrivate>::detach(&this->d);
  pQVar2 = (this->d).d.ptr;
  local_58 = ZEXT816(0);
  local_48 = 0;
  uVar1._0_2_ = pQVar2->valueDelimiter;
  uVar1._2_2_ = pQVar2->pairDelimiter;
  auVar16 = pshuflw(ZEXT416(uVar1),ZEXT416(uVar1),0xe1);
  _local_40 = CONCAT44(0x23,auVar16._0_4_);
  in.m_data = (key->d).ptr;
  in.m_size = (key->d).size;
  qVar7 = qt_urlRecode((QString *)local_58,in,(ComponentFormattingOptions)0x2000000,
                       (ushort *)&local_40);
  qVar13 = local_48;
  if (qVar7 == 0) {
    local_68 = &((key->d).d)->super_QArrayData;
    pcVar15 = (key->d).ptr;
    qVar13 = (key->d).size;
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_68->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    local_68 = (QArrayData *)local_58._0_8_;
    pcVar15 = (char16_t *)local_58._8_8_;
    local_58 = (undefined1  [16])0x0;
    local_48 = 0;
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  ppVar3 = (pQVar2->itemList).d.ptr;
  lVar4 = (pQVar2->itemList).d.size;
  ppVar12 = ppVar3;
  if (0 < lVar4 >> 2) {
    lVar14 = (lVar4 >> 2) + 1;
    ppVar12 = ppVar3 + 2;
    do {
      ppVar10 = ppVar12;
      lVar5 = ppVar10[-2].first.d.size;
      if ((lVar5 == qVar13) &&
         (rhs.m_data = pcVar15, rhs.m_size = qVar13, lhs.m_data = ppVar10[-2].first.d.ptr,
         lhs.m_size = lVar5, bVar6 = QtPrivate::equalStrings(lhs,rhs), bVar6)) {
        ppVar10 = ppVar10 + -2;
        goto LAB_00269762;
      }
      lVar5 = ppVar10[-1].first.d.size;
      if ((lVar5 == qVar13) &&
         (rhs_00.m_data = pcVar15, rhs_00.m_size = qVar13, lhs_00.m_data = ppVar10[-1].first.d.ptr,
         lhs_00.m_size = lVar5, bVar6 = QtPrivate::equalStrings(lhs_00,rhs_00), bVar6)) {
        ppVar10 = ppVar10 + -1;
        goto LAB_00269762;
      }
      lVar5 = (ppVar10->first).d.size;
      if ((lVar5 == qVar13) &&
         (rhs_01.m_data = pcVar15, rhs_01.m_size = qVar13, lhs_01.m_data = (ppVar10->first).d.ptr,
         lhs_01.m_size = lVar5, bVar6 = QtPrivate::equalStrings(lhs_01,rhs_01), bVar6))
      goto LAB_00269762;
      lVar5 = ppVar10[1].first.d.size;
      if ((lVar5 == qVar13) &&
         (rhs_02.m_data = pcVar15, rhs_02.m_size = qVar13, lhs_02.m_data = ppVar10[1].first.d.ptr,
         lhs_02.m_size = lVar5, bVar6 = QtPrivate::equalStrings(lhs_02,rhs_02), bVar6)) {
        ppVar10 = ppVar10 + 1;
        goto LAB_00269762;
      }
      lVar14 = lVar14 + -1;
      ppVar12 = ppVar10 + 4;
    } while (1 < lVar14);
    ppVar12 = ppVar10 + 2;
  }
  ppVar9 = ppVar3 + lVar4;
  lVar14 = ((long)ppVar9 - (long)ppVar12 >> 4) * -0x5555555555555555;
  if (lVar14 == 1) {
LAB_00269723:
    lVar14 = (ppVar12->first).d.size;
    ppVar10 = ppVar9;
    if ((lVar14 == qVar13) &&
       (rhs_05.m_data = pcVar15, rhs_05.m_size = qVar13, lhs_05.m_data = (ppVar12->first).d.ptr,
       lhs_05.m_size = lVar14, bVar6 = QtPrivate::equalStrings(lhs_05,rhs_05), bVar6)) {
      ppVar10 = ppVar12;
    }
  }
  else {
    ppVar10 = ppVar12;
    if (lVar14 == 2) {
LAB_002696fe:
      lVar14 = (ppVar10->first).d.size;
      if ((lVar14 != qVar13) ||
         (rhs_04.m_data = pcVar15, rhs_04.m_size = qVar13, lhs_04.m_data = (ppVar10->first).d.ptr,
         lhs_04.m_size = lVar14, bVar6 = QtPrivate::equalStrings(lhs_04,rhs_04), !bVar6)) {
        ppVar12 = ppVar10 + 1;
        goto LAB_00269723;
      }
    }
    else {
      ppVar10 = ppVar9;
      if ((lVar14 == 3) &&
         ((lVar14 = (ppVar12->first).d.size, lVar14 != qVar13 ||
          (rhs_03.m_data = pcVar15, rhs_03.m_size = qVar13, lhs_03.m_data = (ppVar12->first).d.ptr,
          lhs_03.m_size = lVar14, bVar6 = QtPrivate::equalStrings(lhs_03,rhs_03), ppVar10 = ppVar12,
          !bVar6)))) {
        ppVar10 = ppVar12 + 1;
        goto LAB_002696fe;
      }
    }
  }
LAB_00269762:
  lVar14 = (long)ppVar10 - (long)ppVar3;
  if ((lVar14 >> 4) * -0x5555555555555555 - lVar4 != 0) {
    this_00 = &pQVar2->itemList;
    aend = QList<std::pair<QString,_QString>_>::end(this_00);
    iVar8 = QList<std::pair<QString,_QString>_>::begin(this_00);
    abegin.i = iVar8.i + lVar14;
    ppVar11 = (type)(lVar14 + (long)iVar8.i);
    while (__p = ppVar11 + 1, __p != aend.i) {
      lVar4 = ppVar11[1].first.d.size;
      if ((lVar4 != qVar13) ||
         (rhs_06.m_data = pcVar15, rhs_06.m_size = qVar13, lhs_06.m_data = ppVar11[1].first.d.ptr,
         lhs_06.m_size = lVar4, bVar6 = QtPrivate::equalStrings(lhs_06,rhs_06), ppVar11 = __p,
         !bVar6)) {
        std::pair<QString,_QString>::operator=(abegin.i,__p);
        abegin.i = abegin.i + 1;
        ppVar11 = __p;
      }
    }
    QList<std::pair<QString,_QString>_>::erase(this_00,abegin,(const_iterator)aend.i);
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
LAB_002697fe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlQuery::removeAllQueryItems(const QString &key)
{
    if (d.constData()) {
        auto *p = d.data();
        const QString encodedKey = p->recodeFromUser(key);
        auto firstEqualsEncodedKey = [&encodedKey](const std::pair<QString, QString> &item) {
            return item.first == encodedKey;
        };
        p->itemList.removeIf(firstEqualsEncodedKey);
    }
}